

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Float __thiscall pbrt::SobolSampler::SampleDimension(SobolSampler *this,int dimension)

{
  RandomizeStrategy RVar1;
  int64_t a;
  uint64_t uVar2;
  CranleyPattersonRotator randomizer;
  float fVar3;
  
  if ((dimension < 2) || (this->randomizeStrategy == None)) {
    fVar3 = SobolSampleFloat<pbrt::NoRandomizer>(this->sobolIndex,dimension);
    return fVar3;
  }
  uVar2 = MixBits((long)*Options ^ (ulong)(uint)dimension << 0x20);
  RVar1 = this->randomizeStrategy;
  a = this->sobolIndex;
  randomizer.delta = (uint32_t)uVar2;
  if (RVar1 == FastOwen) {
    fVar3 = SobolSampleFloat<pbrt::FastOwenScrambler>
                      (a,dimension,(FastOwenScrambler)randomizer.delta);
    return fVar3;
  }
  if (RVar1 != PermuteDigits) {
    if (RVar1 == CranleyPatterson) {
      fVar3 = SobolSampleFloat<pbrt::CranleyPattersonRotator>(a,dimension,randomizer);
      return fVar3;
    }
    fVar3 = SobolSampleFloat<pbrt::OwenScrambler>(a,dimension,(OwenScrambler)randomizer.delta);
    return fVar3;
  }
  fVar3 = SobolSampleFloat<pbrt::BinaryPermuteScrambler>
                    (a,dimension,(BinaryPermuteScrambler)randomizer.delta);
  return fVar3;
}

Assistant:

PBRT_CPU_GPU
    Float SampleDimension(int dimension) const {
        // Return un-randomized Sobol sample if appropriate
        if (dimension < 2 || randomizeStrategy == RandomizeStrategy::None)
            return SobolSample(sobolIndex, dimension, NoRandomizer());

        // Return randomized Sobol sample using _randomizeStrategy_
        uint32_t hash = MixBits((uint64_t(dimension) << 32) ^ GetOptions().seed);
        if (randomizeStrategy == RandomizeStrategy::CranleyPatterson)
            return SobolSample(sobolIndex, dimension, CranleyPattersonRotator(hash));
        else if (randomizeStrategy == RandomizeStrategy::PermuteDigits)
            return SobolSample(sobolIndex, dimension, BinaryPermuteScrambler(hash));
        else if (randomizeStrategy == RandomizeStrategy::FastOwen)
            return SobolSample(sobolIndex, dimension, FastOwenScrambler(hash));
        else
            return SobolSample(sobolIndex, dimension, OwenScrambler(hash));
    }